

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_example.cc
# Opt level: O0

GameResult SimulateGame(HanabiGame *game,bool verbose,mt19937 *rng)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __wbegin;
  GameResult GVar1;
  bool bVar2;
  int iVar3;
  result_type __n;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  const_reference pvVar8;
  ostream *poVar9;
  byte in_SIL;
  int i_1;
  value_type move;
  uniform_int_distribution<unsigned_long> dist;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  legal_moves;
  int i;
  value_type move_1;
  discrete_distribution<unsigned_long> dist_1;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  chance_outcomes;
  HanabiState state;
  GameResult result;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  ostream *in_stack_fffffffffffffd20;
  HanabiState *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd60;
  HanabiGame *in_stack_fffffffffffffd68;
  HanabiState *in_stack_fffffffffffffd70;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_> *this;
  string local_260 [32];
  value_type local_240;
  string local_238 [32];
  string local_218 [16];
  HanabiState *in_stack_fffffffffffffdf8;
  HanabiMove in_stack_fffffffffffffe00;
  int local_1f4;
  string local_1f0 [32];
  value_type local_1d0;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  local_1b8;
  value_type local_1a0;
  string local_198 [32];
  string local_178 [36];
  int local_154;
  value_type local_150;
  double *local_148;
  double *local_140;
  HanabiState *in_stack_fffffffffffffef8;
  HanabiMove *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> local_f0;
  HanabiState local_c8;
  byte local_19;
  int local_c;
  int iStack_8;
  int local_4;
  
  local_19 = in_SIL & 1;
  hanabi_learning_env::HanabiState::HanabiState
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  memset(&local_c,0,0xc);
  while( true ) {
    bVar2 = hanabi_learning_env::HanabiState::IsTerminal((HanabiState *)0x12559e);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    iVar3 = hanabi_learning_env::HanabiState::CurPlayer(&local_c8);
    if (iVar3 == -1) {
      hanabi_learning_env::HanabiState::ChanceOutcomes(in_stack_fffffffffffffd28);
      local_140 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca8);
      local_148 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca8);
      __wbegin._M_current._4_4_ = in_stack_fffffffffffffcc4;
      __wbegin._M_current._0_4_ = in_stack_fffffffffffffcc0;
      std::discrete_distribution<unsigned_long>::
      discrete_distribution<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((discrete_distribution<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),__wbegin,
                 in_stack_fffffffffffffcb8);
      this = (vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
              *)&stack0xfffffffffffffef8;
      __n = std::discrete_distribution<unsigned_long>::operator()
                      ((discrete_distribution<unsigned_long> *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8);
      pvVar4 = std::
               vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ::operator[](this,__n);
      local_150 = *pvVar4;
      if ((local_19 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"Legal chance:");
        local_154 = 0;
        while( true ) {
          uVar5 = (ulong)local_154;
          sVar6 = std::
                  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ::size((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                          *)&stack0xfffffffffffffef8);
          if (sVar6 <= uVar5) break;
          poVar9 = std::operator<<((ostream *)&std::cout," <");
          std::
          vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          ::operator[]((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                        *)&stack0xfffffffffffffef8,(long)local_154);
          hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(in_stack_ffffffffffffff08);
          poVar9 = std::operator<<(poVar9,local_178);
          poVar9 = std::operator<<(poVar9,", ");
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_f0,(long)local_154);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar7);
          std::operator<<(poVar9,">");
          std::__cxx11::string::~string(local_178);
          local_154 = local_154 + 1;
        }
        std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<((ostream *)&std::cout,"Sampled move: ");
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(in_stack_ffffffffffffff08);
        poVar9 = std::operator<<(poVar9,local_198);
        std::operator<<(poVar9,"\n\n");
        std::__cxx11::string::~string(local_198);
      }
      local_1a0 = local_150;
      hanabi_learning_env::HanabiState::ApplyMove
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00);
      std::discrete_distribution<unsigned_long>::~discrete_distribution
                ((discrete_distribution<unsigned_long> *)0x125934);
      std::
      pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
      ::~pair((pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
               *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    }
    else {
      hanabi_learning_env::HanabiState::CurPlayer(&local_c8);
      hanabi_learning_env::HanabiState::LegalMoves
                (in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::size(&local_1b8);
      std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                ((uniform_int_distribution<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (unsigned_long)in_stack_fffffffffffffca8,0x1259bd);
      in_stack_fffffffffffffd28 =
           (HanabiState *)
           std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)
                      CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                      in_stack_fffffffffffffca8);
      pvVar4 = std::
               vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ::operator[](&local_1b8,(size_type)in_stack_fffffffffffffd28);
      local_1d0 = *pvVar4;
      if ((local_19 & 1) != 0) {
        in_stack_fffffffffffffd20 = std::operator<<((ostream *)&std::cout,"Current player: ");
        iVar3 = hanabi_learning_env::HanabiState::CurPlayer(&local_c8);
        poVar9 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd20,iVar3);
        std::operator<<(poVar9,"\n");
        hanabi_learning_env::HanabiState::ToString_abi_cxx11_(in_stack_fffffffffffffef8);
        poVar9 = std::operator<<((ostream *)&std::cout,local_1f0);
        std::operator<<(poVar9,"\n\n");
        std::__cxx11::string::~string(local_1f0);
        std::operator<<((ostream *)&std::cout,"Legal moves:");
        local_1f4 = 0;
        while( true ) {
          sVar6 = std::
                  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ::size(&local_1b8);
          if (sVar6 <= (ulong)(long)local_1f4) break;
          poVar9 = std::operator<<((ostream *)&std::cout," ");
          std::
          vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          ::operator[](&local_1b8,(long)local_1f4);
          hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(in_stack_ffffffffffffff08);
          std::operator<<(poVar9,local_218);
          std::__cxx11::string::~string(local_218);
          local_1f4 = local_1f4 + 1;
        }
        std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<((ostream *)&std::cout,"Sampled move: ");
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(in_stack_ffffffffffffff08);
        poVar9 = std::operator<<(poVar9,local_238);
        std::operator<<(poVar9,"\n\n");
        std::__cxx11::string::~string(local_238);
      }
      local_240 = local_1d0;
      hanabi_learning_env::HanabiState::ApplyMove
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00);
      local_4 = local_4 + 1;
      hanabi_learning_env::HanabiState::MoveHistory(&local_c8);
      pvVar8 = std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::back((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                       *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      if ((pvVar8->scored & 1U) != 0) {
        iStack_8 = iStack_8 + 1;
      }
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::~vector((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                 *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    }
  }
  if ((local_19 & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Game done, terminal state:\n");
    hanabi_learning_env::HanabiState::ToString_abi_cxx11_(in_stack_fffffffffffffef8);
    poVar9 = std::operator<<(poVar9,local_260);
    std::operator<<(poVar9,"\n\n");
    std::__cxx11::string::~string(local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"score = ");
    iVar3 = hanabi_learning_env::HanabiState::Score
                      ((HanabiState *)in_stack_fffffffffffffcb8._M_current);
    in_stack_fffffffffffffcb8._M_current = (double *)std::ostream::operator<<(poVar9,iVar3);
    std::operator<<((ostream *)in_stack_fffffffffffffcb8._M_current,"\n\n");
  }
  local_c = hanabi_learning_env::HanabiState::Score
                      ((HanabiState *)in_stack_fffffffffffffcb8._M_current);
  hanabi_learning_env::HanabiState::~HanabiState
            ((HanabiState *)CONCAT44(local_c,in_stack_fffffffffffffcb0));
  GVar1.fireworks_played = iStack_8;
  GVar1.score = local_c;
  GVar1.num_steps = local_4;
  return GVar1;
}

Assistant:

GameResult SimulateGame(const hanabi_learning_env::HanabiGame& game,
                        bool verbose, std::mt19937* rng) {
  hanabi_learning_env::HanabiState state(&game);
  GameResult result = {0, 0, 0};
  while (!state.IsTerminal()) {
    if (state.CurPlayer() == hanabi_learning_env::kChancePlayerId) {
      // All of this could be replaced with state.ApplyRandomChance().
      // Only done this way to demonstrate picking specific chance moves.
      auto chance_outcomes = state.ChanceOutcomes();
      std::discrete_distribution<std::mt19937::result_type> dist(
          chance_outcomes.second.begin(), chance_outcomes.second.end());
      auto move = chance_outcomes.first[dist(*rng)];
      if (verbose) {
        std::cout << "Legal chance:";
        for (int i = 0; i < chance_outcomes.first.size(); ++i) {
          std::cout << " <" << chance_outcomes.first[i].ToString() << ", "
                    << chance_outcomes.second[i] << ">";
        }
        std::cout << "\n";
        std::cout << "Sampled move: " << move.ToString() << "\n\n";
      }
      state.ApplyMove(move);
      continue;
    }

    auto legal_moves = state.LegalMoves(state.CurPlayer());
    std::uniform_int_distribution<std::mt19937::result_type> dist(
        0, legal_moves.size() - 1);
    auto move = legal_moves[dist(*rng)];
    if (verbose) {
      std::cout << "Current player: " << state.CurPlayer() << "\n";
      std::cout << state.ToString() << "\n\n";
      std::cout << "Legal moves:";
      for (int i = 0; i < legal_moves.size(); ++i) {
        std::cout << " " << legal_moves[i].ToString();
      }
      std::cout << "\n";
      std::cout << "Sampled move: " << move.ToString() << "\n\n";
    }
    state.ApplyMove(move);
    ++result.num_steps;
    if (state.MoveHistory().back().scored) {
      ++result.fireworks_played;
    }
  }

  if (verbose) {
    std::cout << "Game done, terminal state:\n" << state.ToString() << "\n\n";
    std::cout << "score = " << state.Score() << "\n\n";
  }

  result.score = state.Score();
  return result;
}